

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O3

int __thiscall XMLParser::XMLNode::indexText(XMLNode *this,char *lpszValue)

{
  uint uVar1;
  XMLNodeData *pXVar2;
  ulong uVar3;
  
  pXVar2 = this->d;
  if (pXVar2 != (XMLNodeData *)0x0) {
    uVar1 = pXVar2->nText;
    if (lpszValue == (char *)0x0) {
      return -(uint)((ulong)uVar1 == 0);
    }
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        if (pXVar2->pText[uVar3] == lpszValue) {
          return (int)uVar3;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  return -1;
}

Assistant:

int XMLNode::indexText(XMLCSTR lpszValue) const
    {
        if(!d)
            return -1;
        int i, l = d->nText;
        if(!lpszValue)
        {
            if(l)
                return 0;
            return -1;
        }
        XMLCSTR * p = d->pText;
        for(i = 0; i < l; i++)
            if(lpszValue == p[i])
                return i;
        return -1;
    }